

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O2

DiagnosticStream * __thiscall
spvtools::opt::GraphicsRobustAccessPass::Fail
          (DiagnosticStream *__return_storage_ptr__,GraphicsRobustAccessPass *this)

{
  spv_position_t position;
  int iVar1;
  undefined4 extraout_var;
  allocator<char> local_239;
  undefined8 local_238;
  undefined8 uStack_230;
  size_t local_228;
  string local_220;
  DiagnosticStream local_200;
  
  (this->super_Pass).field_0x35 = 1;
  local_238 = 0;
  uStack_230 = 0;
  local_228 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"",&local_239);
  position.column = uStack_230;
  position.line = local_238;
  position.index = local_228;
  DiagnosticStream::DiagnosticStream
            (&local_200,position,&(this->super_Pass).consumer_,&local_220,SPV_ERROR_INVALID_BINARY);
  iVar1 = (*(this->super_Pass)._vptr_Pass[2])(this);
  std::operator<<((ostream *)&local_200,(char *)CONCAT44(extraout_var,iVar1));
  std::operator<<((ostream *)&local_200,": ");
  DiagnosticStream::DiagnosticStream(__return_storage_ptr__,&local_200);
  DiagnosticStream::~DiagnosticStream(&local_200);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

spvtools::DiagnosticStream GraphicsRobustAccessPass::Fail() {
  module_status_.failed = true;
  // We don't really have a position, and we'll ignore the result.
  return std::move(
      spvtools::DiagnosticStream({}, consumer(), "", SPV_ERROR_INVALID_BINARY)
      << name() << ": ");
}